

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O2

int MD5_Final(uchar *md,MD5_CTX *c)

{
  uint *data;
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar4 = (ulong)(c->A & 0x3f);
  data = c->data;
  lVar6 = uVar4 + 1;
  *(undefined1 *)((long)c->data + uVar4) = 0x80;
  uVar4 = uVar4 ^ 0x3f;
  uVar5 = uVar4;
  if (uVar4 < 8) {
    uVar5 = 0x40;
    memset((void *)(lVar6 + (long)data),0,uVar4);
    body((MD5_CTX *)c,data,0x40);
    lVar6 = 0;
  }
  memset((void *)(lVar6 + (long)data),0,uVar5 - 8);
  uVar1 = c->A;
  uVar2 = c->B;
  c->A = uVar1 * 8;
  *(char *)(c->data + 0xe) = (char)(uVar1 * 8);
  *(char *)((long)c->data + 0x39) = (char)(uVar1 >> 5);
  *(char *)((long)c->data + 0x3a) = (char)(uVar1 >> 0xd);
  *(char *)((long)c->data + 0x3b) = (char)(uVar1 >> 0x15);
  c->data[0xf] = uVar2;
  body((MD5_CTX *)c,data,0x40);
  *md = (uchar)c->C;
  md[1] = *(uchar *)((long)&c->C + 1);
  md[2] = *(uchar *)((long)&c->C + 2);
  md[3] = *(uchar *)((long)&c->C + 3);
  md[4] = (uchar)c->D;
  md[5] = *(uchar *)((long)&c->D + 1);
  md[6] = *(uchar *)((long)&c->D + 2);
  md[7] = *(uchar *)((long)&c->D + 3);
  md[8] = (uchar)c->Nl;
  md[9] = *(uchar *)((long)&c->Nl + 1);
  md[10] = *(uchar *)((long)&c->Nl + 2);
  md[0xb] = *(uchar *)((long)&c->Nl + 3);
  md[0xc] = (uchar)c->Nh;
  md[0xd] = *(uchar *)((long)&c->Nh + 1);
  md[0xe] = *(uchar *)((long)&c->Nh + 2);
  md[0xf] = *(uchar *)((long)&c->Nh + 3);
  pvVar3 = memset(c,0,0x98);
  return (int)pvVar3;
}

Assistant:

void MD5_Final(unsigned char *result, MD5_CTX *ctx)
{
	unsigned long used, available;

	used = ctx->lo & 0x3f;

	ctx->buffer[used++] = 0x80;

	available = 64 - used;

	if (available < 8) {
		memset(&ctx->buffer[used], 0, available);
		body(ctx, ctx->buffer, 64);
		used = 0;
		available = 64;
	}

	memset(&ctx->buffer[used], 0, available - 8);

	ctx->lo <<= 3;
	ctx->buffer[56] = ctx->lo;
	ctx->buffer[57] = ctx->lo >> 8;
	ctx->buffer[58] = ctx->lo >> 16;
	ctx->buffer[59] = ctx->lo >> 24;
	ctx->buffer[60] = ctx->hi;
	ctx->buffer[61] = ctx->hi >> 8;
	ctx->buffer[62] = ctx->hi >> 16;
	ctx->buffer[63] = ctx->hi >> 24;

	body(ctx, ctx->buffer, 64);

	result[0] = ctx->a;
	result[1] = ctx->a >> 8;
	result[2] = ctx->a >> 16;
	result[3] = ctx->a >> 24;
	result[4] = ctx->b;
	result[5] = ctx->b >> 8;
	result[6] = ctx->b >> 16;
	result[7] = ctx->b >> 24;
	result[8] = ctx->c;
	result[9] = ctx->c >> 8;
	result[10] = ctx->c >> 16;
	result[11] = ctx->c >> 24;
	result[12] = ctx->d;
	result[13] = ctx->d >> 8;
	result[14] = ctx->d >> 16;
	result[15] = ctx->d >> 24;

	memset(ctx, 0, sizeof(*ctx));
}